

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoad.h
# Opt level: O0

ChLoad<MyLoaderTriangular> * __thiscall
chrono::ChLoad<MyLoaderTriangular>::Clone(ChLoad<MyLoaderTriangular> *this)

{
  ChLoad<MyLoaderTriangular> *this_00;
  ChLoad<MyLoaderTriangular> *this_local;
  
  this_00 = (ChLoad<MyLoaderTriangular> *)operator_new(0x68);
  ChLoad(this_00,this);
  return this_00;
}

Assistant:

virtual ChLoad* Clone() const override { return new ChLoad(*this); }